

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_ServerNetworkLayer *
UA_ServerNetworkLayerTCP
          (UA_ServerNetworkLayer *__return_storage_ptr__,UA_ConnectionConfig conf,UA_UInt16 port)

{
  undefined8 *puVar1;
  
  __return_storage_ptr__->getJobs =
       (_func_size_t_UA_ServerNetworkLayer_ptr_UA_Job_ptr_ptr_UA_UInt16 *)0x0;
  __return_storage_ptr__->stop = (_func_size_t_UA_ServerNetworkLayer_ptr_UA_Job_ptr_ptr *)0x0;
  (__return_storage_ptr__->discoveryUrl).data = (UA_Byte *)0x0;
  __return_storage_ptr__->start = (_func_UA_StatusCode_UA_ServerNetworkLayer_ptr_UA_Logger *)0x0;
  __return_storage_ptr__->handle = (void *)0x0;
  (__return_storage_ptr__->discoveryUrl).length = 0;
  __return_storage_ptr__->deleteMembers = (_func_void_UA_ServerNetworkLayer_ptr *)0x0;
  puVar1 = (undefined8 *)calloc(1,0x38);
  if (puVar1 != (undefined8 *)0x0) {
    *(UA_UInt32 *)(puVar1 + 2) = conf.maxChunkCount;
    *puVar1 = conf._0_8_;
    puVar1[1] = conf._8_8_;
    *(UA_UInt16 *)((long)puVar1 + 0x14) = port;
    __return_storage_ptr__->handle = puVar1;
    __return_storage_ptr__->start = ServerNetworkLayerTCP_start;
    __return_storage_ptr__->getJobs = ServerNetworkLayerTCP_getJobs;
    __return_storage_ptr__->stop = ServerNetworkLayerTCP_stop;
    __return_storage_ptr__->deleteMembers = ServerNetworkLayerTCP_deleteMembers;
  }
  return __return_storage_ptr__;
}

Assistant:

UA_ServerNetworkLayer
UA_ServerNetworkLayerTCP(UA_ConnectionConfig conf, UA_UInt16 port) {
#ifdef _WIN32
    WORD wVersionRequested;
    WSADATA wsaData;
    wVersionRequested = MAKEWORD(2, 2);
    WSAStartup(wVersionRequested, &wsaData);
#endif

    UA_ServerNetworkLayer nl;
    memset(&nl, 0, sizeof(UA_ServerNetworkLayer));
    ServerNetworkLayerTCP *layer = calloc(1,sizeof(ServerNetworkLayerTCP));
    if(!layer)
        return nl;
    
    layer->conf = conf;
    layer->port = port;

    nl.handle = layer;
    nl.start = ServerNetworkLayerTCP_start;
    nl.getJobs = ServerNetworkLayerTCP_getJobs;
    nl.stop = ServerNetworkLayerTCP_stop;
    nl.deleteMembers = ServerNetworkLayerTCP_deleteMembers;
    return nl;
}